

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O2

bool node::DumpMempool(CTxMemPool *pool,path *dump_path,FopenFn mockable_fopen_function,
                      bool skip_file_commit)

{
  long lVar1;
  mapped_type_conflict1 mVar2;
  string_view source_file;
  path src;
  path dest;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  mapped_type_conflict1 *pmVar7;
  _Base_ptr p_Var8;
  long lVar9;
  Logger *pLVar10;
  runtime_error *this;
  undefined4 in_ECX;
  undefined7 in_register_00000011;
  char *p2;
  char *p2_00;
  TxMempoolInfo *i;
  pointer pTVar11;
  FILE *__stream;
  char *args_2;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file_00;
  string_view source_file_01;
  Span<std::byte> output;
  string_view str;
  string_view logging_function_01;
  string *this_00;
  char *in_stack_fffffffffffffcc0;
  unsigned_long *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd4;
  path *__p;
  path *ppVar12;
  long lVar13;
  double in_stack_fffffffffffffcf8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> in_stack_fffffffffffffd00;
  double local_2f8;
  uint64_t mempool_transactions_to_write;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_2e8;
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_2b8;
  AutoFile local_298;
  vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> vinfo;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock8;
  path local_240;
  path local_218;
  path local_1f0;
  string log_msg;
  path local_140;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar6 = std::chrono::_V2::steady_clock::now();
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapDeltas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
      ::dump_mutex == '\0') {
    iVar5 = __cxa_guard_acquire(&DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
                                 ::dump_mutex);
    if (iVar5 != 0) {
      __cxa_guard_release(&DumpMempool(CTxMemPool_const&,fs::path_const&,std::function<_IO_FILE*(fs::path_const&,char_const*)>,bool)
                           ::dump_mutex);
    }
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (&criticalblock8,&DumpMempool::dump_mutex,"dump_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
             ,0x9e,false);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock9,&pool->cs,"pool.cs",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
             ,0xa1,false);
  for (p_Var8 = (pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(pool->mapDeltas)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
    mVar2 = *(mapped_type_conflict1 *)(p_Var8 + 2);
    pmVar7 = std::
             map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
             ::operator[](&mapDeltas,(key_type *)(p_Var8 + 1));
    *pmVar7 = mVar2;
  }
  CTxMemPool::infoAll((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)&log_msg,pool);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::_M_move_assign(&vinfo,&log_msg);
  std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector
            ((vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_> *)&log_msg);
  CTxMemPool::GetUnbroadcastTxs
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&log_msg,pool);
  __p = &dump_path->super_path;
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::operator=(&unbroadcast_txids._M_t,
              (_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)&log_msg);
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               *)&log_msg);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock9.super_unique_lock);
  lVar9 = std::chrono::_V2::steady_clock::now();
  std::filesystem::__cxx11::path::path(&local_140,&dump_path->super_path);
  fs::operator+((path *)&log_msg,(path *)&local_140,p2);
  local_298.m_file =
       std::function<_IO_FILE_*(const_fs::path_&,_const_char_*)>::operator()
                 ((function<_IO_FILE_*(const_fs::path_&,_const_char_*)> *)
                  CONCAT71(in_register_00000011,skip_file_commit),(path *)&log_msg,"wb");
  local_298.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_2b8);
  std::filesystem::__cxx11::path::~path((path *)&log_msg);
  std::filesystem::__cxx11::path::~path(&local_140);
  bVar4 = false;
  if (local_298.m_file == (_IO_FILE *)0x0) {
LAB_0023722c:
    AutoFile::~AutoFile(&local_298);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock8.super_unique_lock);
    std::
    _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
    ::~_Rb_tree(&unbroadcast_txids._M_t);
    std::vector<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>::~vector(&vinfo);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
    ::~_Rb_tree(&mapDeltas._M_t);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return bVar4;
    }
  }
  else {
    ser_writedata64<AutoFile>(&local_298,2 - (ulong)(pool->m_opts).persist_v1_dat);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&xor_key,8,(allocator_type *)&log_msg);
    if ((pool->m_opts).persist_v1_dat == false) {
      FastRandomContext::FastRandomContext((FastRandomContext *)&log_msg,false);
      output.m_size =
           (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      output.m_data =
           xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      FastRandomContext::fillrand((FastRandomContext *)&log_msg,output);
      ChaCha20::~ChaCha20((ChaCha20 *)&log_msg.field_2);
      Serialize<AutoFile,std::byte,std::allocator<std::byte>>(&local_298,&xor_key);
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)&local_2e8,&xor_key);
    std::vector<std::byte,_std::allocator<std::byte>_>::operator=
              (&local_298.m_xor,(vector<std::byte,_std::allocator<std::byte>_> *)&local_2e8);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_2e8);
    mempool_transactions_to_write =
         ((long)vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x30;
    ser_writedata64<AutoFile>(&local_298,mempool_transactions_to_write);
    logging_function._M_str = "DumpMempool";
    logging_function._M_len = 0xb;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
    ;
    source_file_00._M_len = 0x61;
    LogPrintf_<unsigned_long>
              (logging_function,source_file_00,0xbd,
               I2P|VALIDATION|QT|LIBEVENT|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|
               ADDRMAN|ZMQ|TOR,(Level)&mempool_transactions_to_write,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcc8);
    pTVar3 = vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_00 = &log_msg;
    for (pTVar11 = vinfo.super__Vector_base<TxMempoolInfo,_std::allocator<TxMempoolInfo>_>._M_impl.
                   super__Vector_impl_data._M_start; pTVar11 != pTVar3; pTVar11 = pTVar11 + 1) {
      log_msg._M_string_length =
           (size_type)
           (pTVar11->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      log_msg._M_dataplus._M_p = "\x01";
      ParamsWrapper<TransactionSerParams,_const_CTransaction>::Serialize<AutoFile>
                ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)this_00,&local_298);
      ser_writedata64<AutoFile>(&local_298,(pTVar11->m_time).__r);
      ser_writedata64<AutoFile>(&local_298,pTVar11->nFeeDelta);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_long>,_std::_Select1st<std::pair<const_uint256,_long>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
      ::erase(&mapDeltas._M_t,
              &(((pTVar11->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->hash).m_wrapped);
    }
    Serialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
              (&local_298,&mapDeltas);
    log_msg._M_dataplus._M_p =
         (pointer)unbroadcast_txids._M_t._M_impl.super__Rb_tree_header._M_node_count;
    args_2 = "Writing %d unbroadcast transactions to file.\n";
    logging_function_00._M_str = "DumpMempool";
    logging_function_00._M_len = 0xb;
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
    ;
    source_file_01._M_len = 0x61;
    ppVar12 = __p;
    lVar13 = lVar9;
    LogPrintf_<unsigned_long>
              (logging_function_00,source_file_01,199,
               I2P|VALIDATION|QT|LIBEVENT|MEMPOOLREJ|PROXY|RAND|CMPCTBLOCK|REINDEX|SELECTCOINS|
               ADDRMAN|WALLETDB|HTTP|MEMPOOL|TOR,(Level)this_00,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcc8);
    __stream = (FILE *)&unbroadcast_txids;
    Serialize<AutoFile,uint256,std::less<uint256>,std::allocator<uint256>>
              (&local_298,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)__stream);
    if ((char)in_ECX == '\0') {
      bVar4 = FileCommit(local_298.m_file);
      if (bVar4) goto LAB_00237082;
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"FileCommit failed");
    }
    else {
LAB_00237082:
      AutoFile::fclose(&local_298,__stream);
      std::filesystem::__cxx11::path::path(&local_218,__p);
      fs::operator+((path *)&local_1f0,(path *)&local_218,p2_00);
      std::filesystem::__cxx11::path::path(&local_240,__p);
      src.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffcc0;
      src.super_path._M_pathname._M_dataplus._M_p = (pointer)this_00;
      src.super_path._M_pathname.field_2._M_allocated_capacity =
           (size_type)in_stack_fffffffffffffcc8;
      src.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffcd0;
      src.super_path._28_8_ = in_stack_fffffffffffffcd4;
      src.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _4_4_ = in_ECX;
      dest.super_path._M_pathname._M_string_length = lVar13;
      dest.super_path._M_pathname._M_dataplus._M_p = (pointer)ppVar12;
      dest.super_path._M_pathname.field_2._M_allocated_capacity = lVar6;
      dest.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffcf8;
      dest.super_path._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )in_stack_fffffffffffffd00._M_head_impl;
      bVar4 = RenameOver(src,dest);
      std::filesystem::__cxx11::path::~path(&local_240);
      std::filesystem::__cxx11::path::~path(&local_1f0);
      std::filesystem::__cxx11::path::~path(&local_218);
      if (bVar4) {
        std::chrono::_V2::steady_clock::now();
        local_2f8 = (double)(lVar9 - lVar6) / 1000000000.0;
        std::filesystem::file_size(__p);
        pLVar10 = LogInstance();
        bVar4 = BCLog::Logger::Enabled(pLVar10);
        if (bVar4) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<double,double,unsigned_long>
                    ((string *)&criticalblock9,
                     (tinyformat *)
                     "Dumped mempool: %.3fs to copy, %.3fs to dump, %d bytes dumped to file\n",
                     (char *)&local_2f8,(double *)&stack0xfffffffffffffd00,
                     (double *)&stack0xfffffffffffffcf8,(unsigned_long *)args_2);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &criticalblock9);
          std::__cxx11::string::~string((string *)&criticalblock9);
          pLVar10 = LogInstance();
          criticalblock9.super_unique_lock._M_device = (mutex_type *)0x61;
          criticalblock9.super_unique_lock._8_8_ = anon_var_dwarf_4a643a;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/mempool_persist.cpp"
          ;
          source_file._M_len = 0x61;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function_01._M_str = "DumpMempool";
          logging_function_01._M_len = 0xb;
          BCLog::Logger::LogPrintStr(pLVar10,str,logging_function_01,source_file,0xd5,ALL,Info);
          std::__cxx11::string::~string((string *)&log_msg);
        }
        std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
                  (&xor_key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
        bVar4 = true;
        goto LAB_0023722c;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Rename failed");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool DumpMempool(const CTxMemPool& pool, const fs::path& dump_path, FopenFn mockable_fopen_function, bool skip_file_commit)
{
    auto start = SteadyClock::now();

    std::map<uint256, CAmount> mapDeltas;
    std::vector<TxMempoolInfo> vinfo;
    std::set<uint256> unbroadcast_txids;

    static Mutex dump_mutex;
    LOCK(dump_mutex);

    {
        LOCK(pool.cs);
        for (const auto &i : pool.mapDeltas) {
            mapDeltas[i.first] = i.second;
        }
        vinfo = pool.infoAll();
        unbroadcast_txids = pool.GetUnbroadcastTxs();
    }

    auto mid = SteadyClock::now();

    AutoFile file{mockable_fopen_function(dump_path + ".new", "wb")};
    if (file.IsNull()) {
        return false;
    }

    try {
        const uint64_t version{pool.m_opts.persist_v1_dat ? MEMPOOL_DUMP_VERSION_NO_XOR_KEY : MEMPOOL_DUMP_VERSION};
        file << version;

        std::vector<std::byte> xor_key(8);
        if (!pool.m_opts.persist_v1_dat) {
            FastRandomContext{}.fillrand(xor_key);
            file << xor_key;
        }
        file.SetXor(xor_key);

        uint64_t mempool_transactions_to_write(vinfo.size());
        file << mempool_transactions_to_write;
        LogInfo("Writing %u mempool transactions to file...\n", mempool_transactions_to_write);
        for (const auto& i : vinfo) {
            file << TX_WITH_WITNESS(*(i.tx));
            file << int64_t{count_seconds(i.m_time)};
            file << int64_t{i.nFeeDelta};
            mapDeltas.erase(i.tx->GetHash());
        }

        file << mapDeltas;

        LogInfo("Writing %d unbroadcast transactions to file.\n", unbroadcast_txids.size());
        file << unbroadcast_txids;

        if (!skip_file_commit && !FileCommit(file.Get()))
            throw std::runtime_error("FileCommit failed");
        file.fclose();
        if (!RenameOver(dump_path + ".new", dump_path)) {
            throw std::runtime_error("Rename failed");
        }
        auto last = SteadyClock::now();

        LogInfo("Dumped mempool: %.3fs to copy, %.3fs to dump, %d bytes dumped to file\n",
                  Ticks<SecondsDouble>(mid - start),
                  Ticks<SecondsDouble>(last - mid),
                  fs::file_size(dump_path));
    } catch (const std::exception& e) {
        LogInfo("Failed to dump mempool: %s. Continuing anyway.\n", e.what());
        return false;
    }
    return true;
}